

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

bool QTestResult::compare
               (bool success,char *failureMsg,char *val1,char *val2,char *actual,char *expected,
               char *file,int line)

{
  bool bVar1;
  int iVar2;
  char *failureMsg_00;
  long in_FS_OFFSET;
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1038[0] = '\0';
  if (expected == (char *)0x0) {
    qt_assert("expected",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x1b5);
  }
  if (actual != (char *)0x0) {
    iVar2 = QTestLog::verboseLevel();
    if (1 < iVar2) {
      snprintf(local_1038,0x1000,"QCOMPARE(%s, %s)",actual,expected);
      QTestLog::info(local_1038,file,line);
    }
    failureMsg_00 = "Compared values are not the same";
    if (failureMsg != (char *)0x0) {
      failureMsg_00 = failureMsg;
    }
    if (success) {
      if (QTest::expectFailMode != 0) {
        snprintf(local_1038,0x1000,"QCOMPARE(%s, %s) returned TRUE unexpectedly.",actual,expected);
      }
    }
    else if (val1 == (char *)0x0 || val2 == (char *)0x0) {
      snprintf(local_1038,0x1000,"%s");
    }
    else {
      formatFailMessage(local_1038,0x1000,failureMsg_00,val1,val2,actual,expected,CustomCompare);
    }
    bVar1 = checkStatement(success,local_1038,file,line);
    if (val1 != (char *)0x0) {
      operator_delete__(val1);
    }
    if (val2 != (char *)0x0) {
      operator_delete__(val2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar1;
    }
    __stack_chk_fail();
  }
  qt_assert("actual",
            "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
            ,0x1b6);
}

Assistant:

bool QTestResult::compare(bool success, const char *failureMsg,
                          char *val1, char *val2,
                          const char *actual, const char *expected,
                          const char *file, int line)
{
    const bool result = compareHelper(success, failureMsg,
                                      val1 != nullptr ? val1 : "<null>",
                                      val2 != nullptr ? val2 : "<null>",
                                      actual, expected, file, line,
                                      val1 != nullptr && val2 != nullptr);

    // Our caller got these from QTest::toString()
    delete [] val1;
    delete [] val2;

    return result;
}